

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopIsExorType(char *pSop)

{
  while( true ) {
    if (*pSop == '\n') {
      return (int)(pSop[-1] == 'n' || pSop[-1] == 'x');
    }
    if (*pSop == '\0') break;
    pSop = pSop + 1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                ,0x328,"int Abc_SopIsExorType(char *)");
}

Assistant:

int Abc_SopIsExorType( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
            return (int)(*(pCur - 1) == 'x' || *(pCur - 1) == 'n');
    assert( 0 );
    return 0;
}